

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O2

void MyGame_Example_Any_print_json_union
               (flatcc_json_printer_t *ctx,flatcc_json_printer_union_descriptor_t *ud)

{
  byte bVar1;
  
  bVar1 = ud->type - 1;
  if (bVar1 < 4) {
    flatcc_json_printer_union_table
              (ctx,ud,(flatcc_json_printer_table_f *)
                      (&PTR_MyGame_Example_Monster_print_json_table_00133da8)[bVar1]);
    return;
  }
  return;
}

Assistant:

static void MyGame_Example_Any_print_json_union(flatcc_json_printer_t *ctx, flatcc_json_printer_union_descriptor_t *ud)
{
    switch (ud->type) {
    case 1:
        flatcc_json_printer_union_table(ctx, ud, MyGame_Example_Monster_print_json_table);
        break;
    case 2:
        flatcc_json_printer_union_table(ctx, ud, MyGame_Example_TestSimpleTableWithEnum_print_json_table);
        break;
    case 3:
        flatcc_json_printer_union_table(ctx, ud, MyGame_Example2_Monster_print_json_table);
        break;
    case 4:
        flatcc_json_printer_union_table(ctx, ud, MyGame_Example_Alt_print_json_table);
        break;
    default:
        break;
    }
}